

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring_stage9.h
# Opt level: O0

void __thiscall pstring::pstring(pstring *this,pstring *other,allocator_type allocator)

{
  bool bVar1;
  pstring *other_local;
  pstring *this_local;
  allocator_type allocator_local;
  
  (this->m_allocator_).super_polymorphic_allocator<std::byte>._M_resource =
       (memory_resource *)allocator.super_polymorphic_allocator<std::byte>._M_resource;
  this->m_length_ = other->m_length_;
  bVar1 = std::pmr::operator==
                    ((polymorphic_allocator<std::byte> *)this,
                     (polymorphic_allocator<std::byte> *)other);
  if (bVar1) {
    this->m_buffer_ = other->m_buffer_;
    other->m_length_ = 0xffffffffffffffff;
    other->m_buffer_ = (char *)0x0;
  }
  else {
    this->m_buffer_ = (char *)0x0;
    strcpy(this->m_buffer_,other->m_buffer_);
  }
  return;
}

Assistant:

inline
pstring::pstring(pstring&& other, allocator_type allocator)
: m_allocator_(allocator)
, m_length_(other.m_length_)
{
    if (m_allocator_ == other.m_allocator_) {
        m_buffer_       = other.m_buffer_;
        other.m_length_ = static_cast<size_t>(-1);
        other.m_buffer_ = nullptr;
    }
    else {
        m_buffer_ = 0;
        std::strcpy(m_buffer_, other.m_buffer_);
    }
}